

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl3cClipDistance.hpp
# Opt level: O0

bool __thiscall
gl3cts::ClipDistance::Utility::VertexBufferObject<float>::useAsShaderInput
          (VertexBufferObject<float> *this,Program *program,string *input_attribute_name,
          GLint number_of_components)

{
  GLuint GVar1;
  glGetAttribLocationFunc p_Var2;
  bool bVar3;
  GLenum GVar4;
  LinkageStatus *pLVar5;
  GLchar *pGVar6;
  socklen_t __len;
  sockaddr *__addr;
  type_info **__x;
  type_info *int_type;
  type_info *float_type;
  type_info *buffer_type;
  GLint location;
  GLint number_of_components_local;
  string *input_attribute_name_local;
  Program *program_local;
  VertexBufferObject<float> *this_local;
  
  buffer_type._4_4_ = number_of_components;
  _location = input_attribute_name;
  input_attribute_name_local = (string *)program;
  program_local = (Program *)this;
  pLVar5 = Utility::Program::ProgramStatus(program);
  if (pLVar5->program_id != 0) {
    p_Var2 = this->m_gl->getAttribLocation;
    pLVar5 = Utility::Program::ProgramStatus(program);
    GVar1 = pLVar5->program_id;
    pGVar6 = (GLchar *)std::__cxx11::string::c_str();
    buffer_type._0_4_ = (*p_Var2)(GVar1,pGVar6);
    GVar4 = (*this->m_gl->getError)();
    glu::checkError(GVar4,"glGetAttribLocation call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cClipDistance.hpp"
                    ,0x194);
    if (-1 < (int)(GLuint)buffer_type) {
      (*this->m_gl->enableVertexAttribArray)((GLuint)buffer_type);
      GVar4 = (*this->m_gl->getError)();
      __len = 0x19d;
      glu::checkError(GVar4,"glEnableVertexAttribArray call failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cClipDistance.hpp"
                      ,0x19d);
      __x = &buffer_type;
      std::vector<int,_std::allocator<int>_>::push_back
                (&this->m_enabled_arrays,(value_type_conflict1 *)__x);
      bind(this,(int)__x,__addr,__len);
      bVar3 = std::type_info::operator==
                        ((type_info *)&float::typeinfo,(type_info *)&float::typeinfo);
      if (bVar3) {
        (*this->m_gl->vertexAttribPointer)
                  ((GLuint)buffer_type,buffer_type._4_4_,0x1406,'\0',0,(void *)0x0);
        GVar4 = (*this->m_gl->getError)();
        glu::checkError(GVar4,"glVertexAttribPointer call failed.",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cClipDistance.hpp"
                        ,0x1a5);
      }
      else {
        bVar3 = std::type_info::operator==
                          ((type_info *)&float::typeinfo,(type_info *)&int::typeinfo);
        if (!bVar3) {
          return false;
        }
        (*this->m_gl->vertexAttribIPointer)
                  ((GLuint)buffer_type,buffer_type._4_4_,0x1406,0,(void *)0x0);
        GVar4 = (*this->m_gl->getError)();
        glu::checkError(GVar4,"glVertexAttribIPointer call failed.",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cClipDistance.hpp"
                        ,0x1aa);
      }
      return true;
    }
  }
  return false;
}

Assistant:

bool gl3cts::ClipDistance::Utility::VertexBufferObject<T>::useAsShaderInput(Program		program,
																			std::string input_attribute_name,
																			glw::GLint  number_of_components)
{
	if (program.ProgramStatus().program_id)
	{
		glw::GLint location = m_gl.getAttribLocation(program.ProgramStatus().program_id, input_attribute_name.c_str());
		GLU_EXPECT_NO_ERROR(m_gl.getError(), "glGetAttribLocation call failed.");

		if (location >= 0)
		{
			const std::type_info& buffer_type = typeid(T);
			const std::type_info& float_type  = typeid(glw::GLfloat);
			const std::type_info& int_type	= typeid(glw::GLint);

			m_gl.enableVertexAttribArray(location);
			GLU_EXPECT_NO_ERROR(m_gl.getError(), "glEnableVertexAttribArray call failed.");
			m_enabled_arrays.push_back(location);

			bind();

			if (buffer_type == float_type)
			{
				m_gl.vertexAttribPointer(location, number_of_components, GL_FLOAT, false, 0, NULL);
				GLU_EXPECT_NO_ERROR(m_gl.getError(), "glVertexAttribPointer call failed.");
			}
			else if (buffer_type == int_type)
			{
				m_gl.vertexAttribIPointer(location, number_of_components, GL_FLOAT, 0, NULL);
				GLU_EXPECT_NO_ERROR(m_gl.getError(), "glVertexAttribIPointer call failed.");
			}
			else
			{
				return false;
			}

			return true;
		}
	}

	return false;
}